

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O0

bool __thiscall ProxyConfig::initWithFile(ProxyConfig *this,string *configFile)

{
  bool bVar1;
  ParseErrorCode PVar2;
  ulong uVar3;
  char *__filename;
  FILE *__stream;
  Ch *str;
  char *buf;
  uint32_t fileSize;
  FILE *fp;
  string *configFile_local;
  ProxyConfig *this_local;
  
  if ((this->m_isInit & 1U) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      __filename = (char *)std::__cxx11::string::c_str();
      __stream = fopen(__filename,"rb");
      if (__stream == (FILE *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        fseek(__stream,0,2);
        uVar3 = ftell(__stream);
        if ((int)uVar3 == 0) {
          fclose(__stream);
          this_local._7_1_ = false;
        }
        else {
          str = (Ch *)operator_new__((ulong)((int)uVar3 + 1));
          fseek(__stream,0,0);
          fread(str,uVar3 & 0xffffffff,1,__stream);
          fclose(__stream);
          str[uVar3 & 0xffffffff] = '\0';
          rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::Parse(&this->m_document,str,uVar3 & 0xffffffff);
          if (str != (Ch *)0x0) {
            operator_delete__(str);
          }
          bVar1 = rapidjson::
                  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::HasParseError(&this->m_document);
          if (bVar1) {
            PVar2 = rapidjson::
                    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::GetParseError(&this->m_document);
            printf("json parse error: %u",(ulong)PVar2);
            this_local._7_1_ = false;
          }
          else {
            this->m_isInit = true;
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ProxyConfig::initWithFile(const std::string& configFile)
{
	if (m_isInit)
	{
		return false;
	}
	if (configFile.empty())
	{
		return false;
	}

	FILE* fp = fopen(configFile.c_str(), "rb");
	if (fp == NULL)
	{
		return false;
	}

	fseek(fp, 0, SEEK_END);
	uint32_t fileSize = ftell(fp);

	if (fileSize <= 0)
	{
		fclose(fp);
		return false;
	}

	char* buf = new char[fileSize + 1];
	fseek(fp, 0, SEEK_SET);
	fread(buf, fileSize, 1, fp);
	fclose(fp);

	buf[fileSize] = '\0';

	m_document.Parse(buf, fileSize);
	delete[] buf;

	if (m_document.HasParseError())
	{
		printf("json parse error: %u", m_document.GetParseError());
		return false;
	}
	m_isInit = true;
	return true;
}